

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *__stream;
  uint uVar2;
  long lVar3;
  code *pcVar4;
  code *pcVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  
  lVar3 = dlopen("./counter.so",0x101);
  if ((lVar3 == 0) || (pcVar4 = (code *)dlsym(lVar3,"count"), pcVar4 == (code *)0x0)) {
    __stream = _stderr;
    uVar6 = dlerror();
    fprintf(__stream,"Error occured:\n    %s\n",uVar6);
    iVar8 = 0xfb;
  }
  else {
    iVar8 = 0;
    for (uVar7 = 0; uVar7 != 10; uVar7 = uVar7 + 1) {
      pcVar5 = pcVar4;
      if ((uVar7 & 1) == 0) {
        pcVar5 = my_count;
      }
      uVar2 = (*pcVar5)();
      bVar1 = iVar8 != 0;
      iVar8 = 0;
      if (bVar1 || uVar7 != uVar2) {
        iVar8 = 0xfa;
      }
      printf("%d\n",(ulong)uVar2);
    }
  }
  if (lVar3 != 0) {
    dlclose(lVar3);
  }
  return iVar8;
}

Assistant:

int main(int argc, char **argv) {
    void *counter_module;
    int (*count)(void);
    int i, n;
    int result;

    counter_module = dlopen("./counter.so", RTLD_LAZY | RTLD_GLOBAL);
    if(!counter_module) goto error;

    count = dlsym(counter_module, "count");
    if(!count) goto error;

    result = 0;
    for(i=0; i<10; ++i) {
        n = ((i%2) ? count : my_count)();
        result = (result || n != i) ? 250 : 0;
        printf("%d\n", n);
    }

    goto done;
    error:
        fprintf(stderr, "Error occured:\n    %s\n", dlerror());
        result = 251;

    done:
        if(counter_module) dlclose(counter_module);
        return result;
}